

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ColumnSetExpr(Parse *pParse,Table *pTab,Column *pCol,Expr *pExpr)

{
  ushort uVar1;
  Expr *p;
  u16 uVar2;
  ExprList *pEVar3;
  
  pEVar3 = (pTab->u).tab.pDfltList;
  uVar1 = pCol->iDflt;
  if ((pEVar3 == (ExprList *)0x0 || uVar1 == 0) || (pEVar3->nExpr < (int)(uint)uVar1)) {
    if (pEVar3 == (ExprList *)0x0) {
      uVar2 = 1;
    }
    else {
      uVar2 = (short)pEVar3->nExpr + 1;
    }
    pCol->iDflt = uVar2;
    pEVar3 = sqlite3ExprListAppend(pParse,pEVar3,pExpr);
    (pTab->u).tab.pDfltList = pEVar3;
  }
  else {
    p = pEVar3->a[uVar1 - 1].pExpr;
    if (p != (Expr *)0x0) {
      sqlite3ExprDeleteNN(pParse->db,p);
    }
    pEVar3->a[(ulong)pCol->iDflt - 1].pExpr = pExpr;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ColumnSetExpr(
  Parse *pParse,    /* Parsing context */
  Table *pTab,      /* The table containing the column */
  Column *pCol,     /* The column to receive the new DEFAULT expression */
  Expr *pExpr       /* The new default expression */
){
  ExprList *pList;
  assert( IsOrdinaryTable(pTab) );
  pList = pTab->u.tab.pDfltList;
  if( pCol->iDflt==0
   || NEVER(pList==0)
   || NEVER(pList->nExpr<pCol->iDflt)
  ){
    pCol->iDflt = pList==0 ? 1 : pList->nExpr+1;
    pTab->u.tab.pDfltList = sqlite3ExprListAppend(pParse, pList, pExpr);
  }else{
    sqlite3ExprDelete(pParse->db, pList->a[pCol->iDflt-1].pExpr);
    pList->a[pCol->iDflt-1].pExpr = pExpr;
  }
}